

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FBXConverter.cpp
# Opt level: O1

aiMesh * __thiscall
Assimp::FBX::FBXConverter::SetupEmptyMesh(FBXConverter *this,Geometry *mesh,aiNode *nd)

{
  pointer *pppaVar1;
  uint uVar2;
  iterator __position;
  pointer pcVar3;
  int iVar4;
  aiMesh *paVar5;
  mapped_type *this_00;
  ulong __n;
  aiMesh *out_mesh;
  string name;
  aiMesh *local_78;
  Geometry *local_70;
  ulong local_68;
  _func_int **local_60;
  uint local_50;
  undefined4 uStack_4c;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_40;
  
  paVar5 = (aiMesh *)operator_new(0x520);
  paVar5->mPrimitiveTypes = 0;
  paVar5->mNumVertices = 0;
  paVar5->mNumFaces = 0;
  memset(&paVar5->mVertices,0,0xcc);
  paVar5->mBones = (aiBone **)0x0;
  paVar5->mMaterialIndex = 0;
  (paVar5->mName).length = 0;
  (paVar5->mName).data[0] = '\0';
  memset((paVar5->mName).data + 1,0x1b,0x3ff);
  paVar5->mNumAnimMeshes = 0;
  paVar5->mAnimMeshes = (aiAnimMesh **)0x0;
  paVar5->mMethod = 0;
  (paVar5->mAABB).mMin.x = 0.0;
  (paVar5->mAABB).mMin.y = 0.0;
  (paVar5->mAABB).mMin.z = 0.0;
  (paVar5->mAABB).mMax.x = 0.0;
  (paVar5->mAABB).mMax.y = 0.0;
  (paVar5->mAABB).mMax.z = 0.0;
  paVar5->mTextureCoords[0] = (aiVector3D *)0x0;
  paVar5->mTextureCoords[1] = (aiVector3D *)0x0;
  paVar5->mTextureCoords[2] = (aiVector3D *)0x0;
  paVar5->mTextureCoords[3] = (aiVector3D *)0x0;
  paVar5->mTextureCoords[4] = (aiVector3D *)0x0;
  paVar5->mTextureCoords[5] = (aiVector3D *)0x0;
  paVar5->mTextureCoords[6] = (aiVector3D *)0x0;
  paVar5->mTextureCoords[7] = (aiVector3D *)0x0;
  paVar5->mNumUVComponents[0] = 0;
  paVar5->mNumUVComponents[1] = 0;
  paVar5->mNumUVComponents[2] = 0;
  paVar5->mNumUVComponents[3] = 0;
  paVar5->mNumUVComponents[4] = 0;
  paVar5->mNumUVComponents[5] = 0;
  paVar5->mNumUVComponents[6] = 0;
  paVar5->mNumUVComponents[7] = 0;
  paVar5->mColors[0] = (aiColor4D *)0x0;
  paVar5->mColors[1] = (aiColor4D *)0x0;
  paVar5->mColors[2] = (aiColor4D *)0x0;
  paVar5->mColors[3] = (aiColor4D *)0x0;
  paVar5->mColors[4] = (aiColor4D *)0x0;
  paVar5->mColors[5] = (aiColor4D *)0x0;
  paVar5->mColors[6] = (aiColor4D *)0x0;
  paVar5->mColors[7] = (aiColor4D *)0x0;
  __position._M_current =
       (this->meshes).super__Vector_base<aiMesh_*,_std::allocator<aiMesh_*>_>._M_impl.
       super__Vector_impl_data._M_finish;
  local_78 = paVar5;
  if (__position._M_current ==
      (this->meshes).super__Vector_base<aiMesh_*,_std::allocator<aiMesh_*>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage) {
    std::vector<aiMesh*,std::allocator<aiMesh*>>::_M_realloc_insert<aiMesh*const&>
              ((vector<aiMesh*,std::allocator<aiMesh*>> *)&this->meshes,__position,&local_78);
  }
  else {
    *__position._M_current = paVar5;
    pppaVar1 = &(this->meshes).super__Vector_base<aiMesh_*,_std::allocator<aiMesh_*>_>._M_impl.
                super__Vector_impl_data._M_finish;
    *pppaVar1 = *pppaVar1 + 1;
  }
  local_70 = mesh;
  this_00 = std::
            map<const_Assimp::FBX::Geometry_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::less<const_Assimp::FBX::Geometry_*>,_std::allocator<std::pair<const_Assimp::FBX::Geometry_*const,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>_>
            ::operator[](&this->meshes_converted,&local_70);
  local_50 = (int)((ulong)((long)(this->meshes).
                                 super__Vector_base<aiMesh_*,_std::allocator<aiMesh_*>_>._M_impl.
                                 super__Vector_impl_data._M_finish -
                          (long)(this->meshes).
                                super__Vector_base<aiMesh_*,_std::allocator<aiMesh_*>_>._M_impl.
                                super__Vector_impl_data._M_start) >> 3) - 1;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::emplace_back<unsigned_int>
            (this_00,&local_50);
  pcVar3 = (mesh->super_Object).name._M_dataplus._M_p;
  local_70 = (key_type)&local_60;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_70,pcVar3,pcVar3 + (mesh->super_Object).name._M_string_length);
  std::__cxx11::string::substr((ulong)&local_50,(ulong)&local_70);
  iVar4 = std::__cxx11::string::compare((char *)&local_50);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)CONCAT44(uStack_4c,local_50) != &local_40) {
    operator_delete((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)CONCAT44(uStack_4c,local_50),local_40._M_allocated_capacity + 1);
  }
  if (iVar4 == 0) {
    std::__cxx11::string::substr((ulong)&local_50,(ulong)&local_70);
    std::__cxx11::string::operator=((string *)&local_70,(string *)&local_50);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)CONCAT44(uStack_4c,local_50) != &local_40) {
      operator_delete((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)CONCAT44(uStack_4c,local_50),local_40._M_allocated_capacity + 1);
    }
  }
  paVar5 = local_78;
  if (local_68 == 0) {
    if ((aiNode *)&local_78->mName == nd) goto LAB_005cc9c6;
    uVar2 = (nd->mName).length;
    __n = (ulong)uVar2;
    (local_78->mName).length = uVar2;
    memcpy((local_78->mName).data,(nd->mName).data,__n);
  }
  else {
    if (0x3ff < local_68) goto LAB_005cc9c6;
    (local_78->mName).length = (ai_uint32)local_68;
    memcpy((local_78->mName).data,local_70,local_68);
    __n = local_68;
  }
  (paVar5->mName).data[__n] = '\0';
LAB_005cc9c6:
  paVar5 = local_78;
  if (local_70 != (key_type)&local_60) {
    operator_delete(local_70,(long)local_60 + 1);
  }
  return paVar5;
}

Assistant:

aiMesh* FBXConverter::SetupEmptyMesh(const Geometry& mesh, aiNode& nd)
        {
            aiMesh* const out_mesh = new aiMesh();
            meshes.push_back(out_mesh);
            meshes_converted[&mesh].push_back(static_cast<unsigned int>(meshes.size() - 1));

            // set name
            std::string name = mesh.Name();
            if (name.substr(0, 10) == "Geometry::") {
                name = name.substr(10);
            }

            if (name.length()) {
                out_mesh->mName.Set(name);
            }
            else
            {
                out_mesh->mName = nd.mName;
            }

            return out_mesh;
        }